

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O0

void __thiscall
cppcms::impl::cgi::connection::async_write_handler::async_write_handler
          (async_write_handler *this,conn_type *c,vector<char,_std::allocator<char>_> *d,
          handler *hin)

{
  undefined8 *in_RDI;
  const_buffer *in_stack_ffffffffffffff38;
  callable<void_(const_std::error_code_&)> *in_stack_ffffffffffffff40;
  const_buffer *this_00;
  vector<char,_std::allocator<char>_> *__x;
  vector<char,_std::allocator<char>_> *this_01;
  mutable_buffer *other;
  const_buffer *in_stack_ffffffffffffff70;
  
  booster::callable<void_(const_std::error_code_&)>::callable(in_stack_ffffffffffffff40);
  *in_RDI = &PTR__async_write_handler_0052ab10;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x3803fa);
  other = (mutable_buffer *)(in_RDI + 5);
  booster::aio::const_buffer::const_buffer((const_buffer *)0x38040d);
  this_01 = (vector<char,_std::allocator<char>_> *)(in_RDI + 0xb);
  booster::callback<void_(const_std::error_code_&)>::callback
            ((callback<void_(const_std::error_code_&)> *)in_stack_ffffffffffffff40,
             (callback<void_(const_std::error_code_&)> *)in_stack_ffffffffffffff38);
  this_00 = (const_buffer *)(in_RDI + 0xc);
  std::shared_ptr<cppcms::impl::cgi::connection>::shared_ptr
            ((shared_ptr<cppcms::impl::cgi::connection> *)this_00,
             (shared_ptr<cppcms::impl::cgi::connection> *)in_stack_ffffffffffffff38);
  __x = (vector<char,_std::allocator<char>_> *)(in_RDI + 2);
  std::vector<char,_std::allocator<char>_>::swap(this_01,__x);
  booster::aio::buffer(__x);
  booster::aio::const_buffer::const_buffer(in_stack_ffffffffffffff70,other);
  booster::aio::const_buffer::operator=(this_00,in_stack_ffffffffffffff38);
  booster::aio::const_buffer::~const_buffer((const_buffer *)0x3804a1);
  booster::aio::mutable_buffer::~mutable_buffer((mutable_buffer *)0x3804ab);
  return;
}

Assistant:

async_write_handler(conn_type const &c,std::vector<char> &d,handler const &hin) :
		h(hin),
		conn(c)
	{
		data.swap(d);
		output = booster::aio::buffer(data);
	}